

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::Context::Context(Context *this,Context *other)

{
  RefOrVoid<const_kj::Exception::Context> orig;
  String *in_RDX;
  Own<kj::Exception::Context,_std::nullptr_t> local_48;
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> local_38;
  Own<kj::Exception::Context,_std::nullptr_t> *local_28;
  Own<kj::Exception::Context,_std::nullptr_t> *n;
  Own<kj::Exception::Context,_std::nullptr_t> *_n985;
  Context *other_local;
  Context *this_local;
  
  this->file = other->file;
  this->line = other->line;
  _n985 = (Own<kj::Exception::Context,_std::nullptr_t> *)other;
  other_local = this;
  str<kj::String_const&>(&this->description,(kj *)&other->description,in_RDX);
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::Maybe(&this->next);
  local_28 = kj::_::readMaybe<kj::Exception::Context,decltype(nullptr)>
                       ((Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> *)&_n985[2].ptr);
  if (local_28 != (Own<kj::Exception::Context,_std::nullptr_t> *)0x0) {
    n = local_28;
    orig = Own<kj::Exception::Context,_std::nullptr_t>::operator*(local_28);
    heap<kj::Exception::Context_const&>((kj *)&local_48,orig);
    Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::Maybe(&local_38,&local_48);
    Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::operator=(&this->next,&local_38);
    Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::~Maybe(&local_38);
    Own<kj::Exception::Context,_std::nullptr_t>::~Own(&local_48);
  }
  return;
}

Assistant:

Exception::Context::Context(const Context& other) noexcept
    : file(other.file), line(other.line), description(str(other.description)) {
  KJ_IF_SOME(n, other.next) {
    next = heap(*n);
  }
}